

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CGetFieldByThisExpression *exp)

{
  CFrame *this_00;
  string *currentClassName;
  CExpressionWrapper *this_01;
  pointer pCVar1;
  IAddress *pIVar2;
  element_type *peVar3;
  element_type *peVar4;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  shared_ptr<VariableInfo> varInfo;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_28;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  CGetFieldByThisExpression *local_18;
  CGetFieldByThisExpression *exp_local;
  CBuildVisitor *this_local;
  
  local_18 = exp;
  exp_local = (CGetFieldByThisExpression *)this;
  std::operator<<((ostream *)&std::cout,"IRT builder: CGetFieldByThisExpression\n");
  this_01 = (CExpressionWrapper *)operator_new(0x10);
  varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 1;
  this_00 = this->currentFrame;
  pCVar1 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
                     (&local_18->fieldIdentifier);
  pIVar2 = IRT::CFrame::GetClassFieldAddress(this_00,&pCVar1->name);
  (*pIVar2->_vptr_IAddress[2])(&local_28);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_20,&local_28);
  IRT::CExpressionWrapper::CExpressionWrapper(this_01,&local_20);
  varInfo.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 0;
  updateSubtreeWrapper(this,(ISubtreeWrapper *)this_01);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_28);
  currentClassName = (string *)this->symbolTable;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&local_18->fieldIdentifier);
  getVariableInfoFromLocalArgAndFields
            ((SymbolTable *)local_48,currentClassName,&this->currentClassName,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  peVar3 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_48);
  peVar4 = std::__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &peVar3->type);
  if ((peVar4->isPrimitive & 1U) == 0) {
    peVar3 = std::__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VariableInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
    peVar4 = std::__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &peVar3->type);
    std::__cxx11::string::operator=
              ((string *)&this->currentObjectClassName,(string *)&peVar4->className);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->currentObjectClassName,"");
  }
  std::shared_ptr<VariableInfo>::~shared_ptr((shared_ptr<VariableInfo> *)local_48);
  return;
}

Assistant:

void CBuildVisitor::Visit( CGetFieldByThisExpression &exp ) {
    std::cout << "IRT builder: CGetFieldByThisExpression\n";
    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            std::move( currentFrame->GetClassFieldAddress( exp.fieldIdentifier->name )->ToExpression( ))));

    auto varInfo = getVariableInfoFromLocalArgAndFields( symbolTable,
                                                         currentClassName,
                                                         "",
                                                         exp.fieldIdentifier->name );

    if ( varInfo->type->isPrimitive ) {
        currentObjectClassName = "";
    } else {
        currentObjectClassName = varInfo->type->className;
    }
}